

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall ViewTest::coordinatesToIndexTest<true>(ViewTest *this)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var2;
  unsigned_long uVar3;
  logic_error *plVar4;
  ulong uVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  size_t sVar8;
  value_type *__val_1;
  value_type *__val;
  size_t index;
  View<int,_true,_std::allocator<unsigned_long>_> v;
  allocator_type local_81;
  size_t local_80;
  CoordinateOrder local_74;
  undefined1 local_70 [16];
  size_t *local_60;
  size_t local_48;
  
  _Var1._M_current = (unsigned_long *)operator_new(0x18);
  *_Var1._M_current = 3;
  _Var1._M_current[1] = 2;
  _Var1._M_current[2] = 4;
  local_80 = CONCAT44(local_80._4_4_,1);
  local_74 = LastMajorOrder;
  local_70._0_8_ = this->data_;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_70 + 8),_Var1,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var1._M_current + 3),(CoordinateOrder *)&local_80,&local_74,&local_81);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_70);
  _Var2._M_current = (unsigned_long *)operator_new(0x18);
  *_Var2._M_current = 0;
  _Var2._M_current[1] = 0;
  _Var2._M_current[2] = 0;
  uVar6 = _Var1._M_current[2];
  if (uVar6 != 0) {
    uVar3 = _Var1._M_current[1];
    uVar7 = 0;
    sVar8 = 0;
    uVar5 = uVar3;
    do {
      _Var2._M_current[1] = 0;
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = *_Var1._M_current;
        uVar6 = 0;
        do {
          *_Var2._M_current = 0;
          if (uVar5 == 0) {
            uVar5 = 0;
          }
          else {
            do {
              local_80 = 100;
              andres::View<int,true,std::allocator<unsigned_long>>::
              coordinatesToIndex<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((View<int,true,std::allocator<unsigned_long>> *)local_70,_Var2,&local_80);
              if (sVar8 != local_80) {
                plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar4,"test failed.");
                __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
              sVar8 = sVar8 + 1;
              uVar6 = *_Var2._M_current;
              *_Var2._M_current = uVar6 + 1;
              uVar5 = *_Var1._M_current;
            } while (uVar6 + 1 < uVar5);
            uVar6 = _Var2._M_current[1];
            uVar3 = _Var1._M_current[1];
          }
          uVar6 = uVar6 + 1;
          _Var2._M_current[1] = uVar6;
        } while (uVar6 < uVar3);
        uVar7 = _Var2._M_current[2];
        uVar6 = _Var1._M_current[2];
        uVar5 = uVar3;
      }
      uVar7 = uVar7 + 1;
      _Var2._M_current[2] = uVar7;
    } while (uVar7 < uVar6);
  }
  operator_delete(_Var2._M_current,0x18);
  operator_delete(local_60,local_48 * 0x18);
  operator_delete(_Var1._M_current,0x18);
  _Var1._M_current = (unsigned_long *)operator_new(0x18);
  *_Var1._M_current = 3;
  _Var1._M_current[1] = 2;
  _Var1._M_current[2] = 4;
  local_80 = CONCAT44(local_80._4_4_,1);
  local_74 = FirstMajorOrder;
  local_70._0_8_ = this->data_;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_70 + 8),_Var1,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var1._M_current + 3),(CoordinateOrder *)&local_80,&local_74,&local_81);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_70);
  _Var2._M_current = (unsigned_long *)operator_new(0x18);
  *_Var2._M_current = 0;
  _Var2._M_current[1] = 0;
  _Var2._M_current[2] = 0;
  uVar6 = *_Var1._M_current;
  if (uVar6 != 0) {
    uVar3 = _Var1._M_current[1];
    uVar7 = 0;
    sVar8 = 0;
    uVar5 = uVar3;
    do {
      _Var2._M_current[1] = 0;
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = _Var1._M_current[2];
        uVar6 = 0;
        do {
          _Var2._M_current[2] = 0;
          if (uVar5 == 0) {
            uVar5 = 0;
          }
          else {
            do {
              local_80 = 100;
              andres::View<int,true,std::allocator<unsigned_long>>::
              coordinatesToIndex<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((View<int,true,std::allocator<unsigned_long>> *)local_70,_Var2,&local_80);
              if (sVar8 != local_80) {
                plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar4,"test failed.");
                __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
              sVar8 = sVar8 + 1;
              uVar6 = _Var2._M_current[2];
              _Var2._M_current[2] = uVar6 + 1;
              uVar5 = _Var1._M_current[2];
            } while (uVar6 + 1 < uVar5);
            uVar6 = _Var2._M_current[1];
            uVar3 = _Var1._M_current[1];
          }
          uVar6 = uVar6 + 1;
          _Var2._M_current[1] = uVar6;
        } while (uVar6 < uVar3);
        uVar7 = *_Var2._M_current;
        uVar6 = *_Var1._M_current;
        uVar5 = uVar3;
      }
      uVar7 = uVar7 + 1;
      *_Var2._M_current = uVar7;
    } while (uVar7 < uVar6);
  }
  operator_delete(_Var2._M_current,0x18);
  operator_delete(local_60,local_48 * 0x18);
  operator_delete(_Var1._M_current,0x18);
  return;
}

Assistant:

void ViewTest::coordinatesToIndexTest() {
    // internalFirstMajorOrder == false
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 2;
        shape[2] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(),
            data_, andres::LastMajorOrder, andres::LastMajorOrder);

        std::vector<std::size_t> c(3);
        std::size_t trueIndex = 0;
        for(c[2]=0; c[2]<shape[2]; ++c[2]) 
        for(c[1]=0; c[1]<shape[1]; ++c[1])
        for(c[0]=0; c[0]<shape[0]; ++c[0]) {
            std::size_t index = 100;
            v.coordinatesToIndex(c.begin(), index);
            test(index == trueIndex);
            ++trueIndex;
        }
    }
    // internalFirstMajorOrder == true
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 2;
        shape[2] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(),
            data_, andres::LastMajorOrder, andres::FirstMajorOrder);

        std::vector<std::size_t> c(3);
        std::size_t trueIndex = 0;
        for(c[0]=0; c[0]<shape[0]; ++c[0]) 
        for(c[1]=0; c[1]<shape[1]; ++c[1])
        for(c[2]=0; c[2]<shape[2]; ++c[2]) {
            std::size_t index = 100;
            v.coordinatesToIndex(c.begin(), index);
            test(index == trueIndex);
            ++trueIndex;
        }
    }
}